

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DnsStats.cpp
# Opt level: O0

TldAsKey * __thiscall TldAsKey::CreateCopy(TldAsKey *this)

{
  TldAsKey *this_00;
  TldAsKey *ret;
  TldAsKey *this_local;
  
  this_00 = (TldAsKey *)operator_new(0x70);
  TldAsKey(this_00,this->tld,this->tld_len,this->max_name_parts);
  if (this_00 != (TldAsKey *)0x0) {
    this_00->count = this->count;
  }
  return this_00;
}

Assistant:

TldAsKey * TldAsKey::CreateCopy()
{
    TldAsKey * ret = new TldAsKey(this->tld, this->tld_len, this->max_name_parts);

    if (ret != NULL)
    {
        ret->count = count;
    }

    return ret;
}